

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::check_done
          (basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  uint uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  char_type *pcVar3;
  char_type *pcVar4;
  char_type *pcVar5;
  span<const_char,_18446744073709551615UL> sVar6;
  
  pbVar2 = (this->source_).source_.stream_ptr_;
  uVar1 = *(uint *)(&pbVar2->field_0x20 + (long)pbVar2->_vptr_basic_istream[-3]);
  if ((uVar1 & 1) != 0) {
    std::error_code::operator=(ec,source_error);
    return;
  }
  if (((uVar1 & 2) != 0) && ((this->source_).source_.buffer_length_ == 0)) {
    basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec);
    return;
  }
  pcVar3 = (this->parser_).input_ptr_;
  pcVar5 = (this->parser_).end_input_;
  do {
    pcVar4 = pcVar5;
    if (pcVar3 == pcVar4) {
      sVar6 = json_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(&this->source_,ec);
      pcVar3 = sVar6.data_;
      if (ec->_M_value != 0) {
        return;
      }
      if (sVar6.size_ == 0) {
        pcVar4 = (this->parser_).end_input_;
        pcVar3 = (this->parser_).input_ptr_;
      }
      else {
        (this->parser_).begin_input_ = pcVar3;
        pcVar4 = pcVar3 + sVar6.size_;
        (this->parser_).end_input_ = pcVar4;
        (this->parser_).input_ptr_ = pcVar3;
      }
    }
    pcVar5 = pcVar4;
    if (pcVar3 != pcVar4) {
      basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec);
      if (ec->_M_value != 0) {
        return;
      }
      pcVar5 = (this->parser_).end_input_;
      pcVar4 = (this->parser_).input_ptr_;
    }
    pcVar3 = pcVar4;
  } while (((pcVar4 != pcVar5) || ((this->source_).source_.buffer_length_ != 0)) ||
          (pbVar2 = (this->source_).source_.stream_ptr_,
          ((&pbVar2->field_0x20)[(long)pbVar2->_vptr_basic_istream[-3]] & 2) == 0));
  return;
}

Assistant:

void check_done(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }   
            if (source_.eof())
            {
                parser_.check_done(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
            else
            {
                do
                {
                    if (parser_.source_exhausted())
                    {
                        auto s = source_.read_buffer(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                        if (s.size() > 0)
                        {
                            parser_.update(s.data(),s.size());
                        }
                    }
                    if (!parser_.source_exhausted())
                    {
                        parser_.check_done(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                    }
                }
                while (!eof());
            }
        }